

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_c14n(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint no;
  xmlDocPtr pxVar7;
  xmlDocPtr pxVar8;
  char *pcVar9;
  xmlOutputBufferPtr pxVar10;
  uint uVar11;
  int nr;
  int nr_00;
  int nr_01;
  xmlDocPtr in_RSI;
  int n_doc;
  uint uVar12;
  int iVar13;
  int local_40;
  int local_38;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing c14n : 3 of 4 functions ...");
  }
  uVar12 = 0;
  local_34 = 0;
  do {
    if (uVar12 == 4) {
      function_tests = function_tests + 1;
      local_38 = 0;
      for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
        bVar1 = true;
        while (bVar1) {
          for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
            uVar11 = 1;
            while (uVar11 != 0) {
              for (no = 0; uVar11 = 0, no != 4; no = no + 1) {
                for (; uVar11 != 6; uVar11 = uVar11 + 1) {
                  pxVar7 = (xmlDocPtr)0x0;
                  while( true ) {
                    iVar4 = (int)in_RSI;
                    iVar13 = (int)pxVar7;
                    if (iVar13 == 4) break;
                    iVar2 = xmlMemBlocks();
                    pxVar8 = gen_xmlDocPtr(uVar12,iVar4);
                    iVar3 = gen_int(uVar5,iVar4);
                    iVar6 = gen_int(no,iVar4);
                    pcVar9 = gen_fileoutput(uVar11,iVar4);
                    iVar4 = gen_int(iVar13,iVar4);
                    in_RSI = (xmlDocPtr)0x0;
                    xmlC14NDocSave(pxVar8,0,iVar3,0,iVar6,pcVar9,iVar4);
                    call_tests = call_tests + 1;
                    des_xmlDocPtr((int)pxVar8,in_RSI,nr_00);
                    xmlResetLastError();
                    iVar4 = xmlMemBlocks();
                    if (iVar2 != iVar4) {
                      iVar4 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlC14NDocSave",
                             (ulong)(uint)(iVar4 - iVar2));
                      local_38 = local_38 + 1;
                      printf(" %d",(ulong)uVar12);
                      printf(" %d",0);
                      printf(" %d",(ulong)uVar5);
                      printf(" %d",0);
                      printf(" %d",(ulong)no);
                      printf(" %d",(ulong)uVar11);
                      printf(" %d");
                      putchar(10);
                      in_RSI = pxVar7;
                    }
                    pxVar7 = (xmlDocPtr)(ulong)(iVar13 + 1);
                  }
                }
              }
            }
          }
          bVar1 = false;
        }
      }
      function_tests = function_tests + 1;
      local_40 = 0;
      for (uVar12 = 0; uVar12 != 4; uVar12 = uVar12 + 1) {
        bVar1 = true;
        while (bVar1) {
          for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
            pxVar7 = (xmlDocPtr)0x1;
            while (pxVar7 != (xmlDocPtr)0x0) {
              for (uVar11 = 0; pxVar7 = (xmlDocPtr)0x0, uVar11 != 4; uVar11 = uVar11 + 1) {
                while( true ) {
                  iVar4 = (int)in_RSI;
                  iVar13 = (int)pxVar7;
                  if (iVar13 == 2) break;
                  iVar2 = xmlMemBlocks();
                  pxVar8 = gen_xmlDocPtr(uVar12,iVar4);
                  iVar3 = gen_int(uVar5,iVar4);
                  iVar6 = gen_int(uVar11,iVar4);
                  pxVar10 = gen_xmlOutputBufferPtr(iVar13,iVar4);
                  in_RSI = (xmlDocPtr)0x0;
                  xmlC14NDocSaveTo(pxVar8,0,iVar3,0,iVar6,pxVar10);
                  call_tests = call_tests + 1;
                  des_xmlDocPtr((int)pxVar8,in_RSI,nr_01);
                  if (pxVar10 != (xmlOutputBufferPtr)0x0) {
                    xmlOutputBufferClose(pxVar10);
                  }
                  xmlResetLastError();
                  iVar4 = xmlMemBlocks();
                  if (iVar2 != iVar4) {
                    iVar4 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlC14NDocSaveTo",
                           (ulong)(uint)(iVar4 - iVar2));
                    local_40 = local_40 + 1;
                    printf(" %d",(ulong)uVar12);
                    printf(" %d",0);
                    printf(" %d",(ulong)uVar5);
                    printf(" %d",0);
                    printf(" %d",(ulong)uVar11);
                    printf(" %d");
                    putchar(10);
                    in_RSI = pxVar7;
                  }
                  pxVar7 = (xmlDocPtr)(ulong)(iVar13 + 1);
                }
              }
            }
          }
          bVar1 = false;
        }
      }
      function_tests = function_tests + 1;
      uVar12 = local_38 + local_34 + local_40;
      if (uVar12 != 0) {
        printf("Module c14n: %d errors\n",(ulong)uVar12);
      }
      return uVar12;
    }
    bVar1 = true;
    while (bVar1) {
      for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
        bVar1 = true;
        while (bVar1) {
          for (iVar13 = 0; iVar13 != 4; iVar13 = iVar13 + 1) {
            bVar1 = true;
            while (iVar4 = (int)in_RSI, bVar1) {
              iVar2 = xmlMemBlocks();
              pxVar7 = gen_xmlDocPtr(uVar12,iVar4);
              iVar3 = gen_int(uVar5,iVar4);
              iVar4 = gen_int(iVar13,iVar4);
              in_RSI = (xmlDocPtr)0x0;
              xmlC14NDocDumpMemory(pxVar7,0,iVar3,0,iVar4,0);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar7,in_RSI,nr);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar2 == iVar4) break;
              iVar4 = xmlMemBlocks();
              bVar1 = false;
              printf("Leak of %d blocks found in xmlC14NDocDumpMemory",(ulong)(uint)(iVar4 - iVar2))
              ;
              local_34 = local_34 + 1;
              printf(" %d",(ulong)uVar12);
              printf(" %d",0);
              printf(" %d",(ulong)uVar5);
              printf(" %d",0);
              printf(" %d");
              in_RSI = (xmlDocPtr)0x0;
              printf(" %d");
              putchar(10);
            }
          }
          bVar1 = false;
        }
      }
      bVar1 = false;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

static int
test_c14n(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing c14n : 3 of 4 functions ...\n");
    test_ret += test_xmlC14NDocDumpMemory();
    test_ret += test_xmlC14NDocSave();
    test_ret += test_xmlC14NDocSaveTo();
    test_ret += test_xmlC14NExecute();

    if (test_ret != 0)
	printf("Module c14n: %d errors\n", test_ret);
    return(test_ret);
}